

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O3

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoPyramid> *this,TPZVec<long> *nodeindexes)

{
  long lVar1;
  
  TPZNodeRep<5,_pztopology::TPZPyramid>::TPZNodeRep
            ((TPZNodeRep<5,_pztopology::TPZPyramid> *)this,&PTR_PTR_0188ebb8,nodeindexes);
  (this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.super_TPZPyramid.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_0188eb58;
  lVar1 = 0x48;
  do {
    *(undefined ***)
     ((long)(this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes +
     lVar1 + -0x18) = &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)
     ((long)(this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes +
     lVar1 + -8) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes +
     lVar1 + -0x10) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1b0);
  lVar1 = 0;
  do {
    TPZTransform<double>::TPZTransform((TPZTransform<double> *)(&this->field_0x1a0 + lVar1));
    lVar1 = lVar1 + 0x1a0;
  } while (lVar1 != 0x1860);
  return;
}

Assistant:

TPZGeoBlend(TPZVec<int64_t> &nodeindexes) : TPZRegisterClassId(&TPZGeoBlend::ClassId),
                                                    TGeo(nodeindexes) {
        }